

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOMPI.cpp
# Opt level: O2

shared_ptr<adios2::core::Engine> __thiscall
adios2::core::anon_unknown_4::MakeEngineMPI<adios2::core::engine::SscWriter>
          (anon_unknown_4 *this,IO *io,string *name,Mode mode,Comm *comm)

{
  char cVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<adios2::core::Engine> sVar2;
  allocator local_bc;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  Comm local_b8 [8];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  cVar1 = adios2::helper::Comm::IsMPI();
  if (cVar1 == '\0') {
    std::__cxx11::string::string((string *)&local_50,"Core",&local_b9);
    std::__cxx11::string::string((string *)&local_70,"IOMPI",&local_ba);
    std::__cxx11::string::string((string *)&local_90,"MakeEngineMPI",&local_bb);
    std::__cxx11::string::string
              ((string *)&local_b0,
               "A MPI-only engine cannot be used with a communicator that is not MPI-based.",
               &local_bc);
    helper::Throw<std::invalid_argument>(&local_50,&local_70,&local_90,&local_b0,-1);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  adios2::helper::Comm::Comm(local_b8,comm);
  IO::MakeEngine<adios2::core::engine::SscWriter>
            ((IO *)this,(string *)io,(Mode)name,(Comm *)(ulong)mode);
  adios2::helper::Comm::~Comm(local_b8);
  sVar2.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<adios2::core::Engine>)
         sVar2.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Engine> MakeEngineMPI(IO &io, const std::string &name, const Mode mode,
                                      helper::Comm comm)
{
    if (!comm.IsMPI())
    {
        helper::Throw<std::invalid_argument>("Core", "IOMPI", "MakeEngineMPI",
                                             "A MPI-only engine cannot be used with a "
                                             "communicator that is not MPI-based.");
    }
    return IO::MakeEngine<T>(io, name, mode, std::move(comm));
}